

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::RALocalAllocator::spillAfterAllocation(RALocalAllocator *this,InstNode *node)

{
  uint32_t uVar1;
  uint32_t workId;
  RAInst *this_00;
  uint32_t physId;
  Error EVar2;
  RATiedReg *pRVar3;
  RAWorkReg *pRVar4;
  uint32_t i;
  uint32_t index;
  uint group;
  
  this_00 = (RAInst *)(node->super_BaseNode)._passData;
  uVar1 = this_00->_tiedTotal;
  index = 0;
  do {
    if (uVar1 == index) {
      return 0;
    }
    pRVar3 = RAInst::tiedAt(this_00,index);
    if ((pRVar3->_flags & 0x20000) != 0) {
      workId = pRVar3->_workId;
      pRVar4 = workRegById(this,workId);
      if (pRVar4->_homeRegId == 0xff) {
        group = (pRVar4->_info)._signature >> 8 & 0xf;
        physId = RAAssignment::workToPhysId(&this->_curAssignment,group,workId);
        if (physId != 0xff) {
          (this->_cc->super_BaseBuilder)._cursor = &node->super_BaseNode;
          EVar2 = onSpillReg(this,group,workId,physId);
          if (EVar2 != 0) {
            return EVar2;
          }
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

Error RALocalAllocator::spillAfterAllocation(InstNode* node) noexcept {
  // This is experimental feature that would spill registers that don't have
  // home-id and are last in this basic block. This prevents saving these regs
  // in other basic blocks and then restoring them (mostly relevant for loops).
  RAInst* raInst = node->passData<RAInst>();
  uint32_t count = raInst->tiedCount();

  for (uint32_t i = 0; i < count; i++) {
    RATiedReg* tiedReg = raInst->tiedAt(i);
    if (tiedReg->isLast()) {
      uint32_t workId = tiedReg->workId();
      RAWorkReg* workReg = workRegById(workId);
      if (!workReg->hasHomeRegId()) {
        uint32_t group = workReg->group();
        uint32_t assignedId = _curAssignment.workToPhysId(group, workId);
        if (assignedId != RAAssignment::kPhysNone) {
          _cc->_setCursor(node);
          ASMJIT_PROPAGATE(onSpillReg(group, workId, assignedId));
        }
      }
    }
  }

  return kErrorOk;
}